

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void musig_test_vectors_nonceagg(void)

{
  int iVar1;
  uint uVar2;
  int expected;
  secp256k1_musig_pubnonce pubnonce_1 [2];
  musig_nonce_agg_test_case *c_1;
  uchar aggnonce66 [66];
  secp256k1_musig_aggnonce aggnonce;
  secp256k1_musig_pubnonce *pubnonce_ptr [2];
  secp256k1_musig_pubnonce pubnonce [2];
  musig_nonce_agg_test_case *c;
  musig_nonce_agg_vector *vector;
  int j;
  size_t i;
  secp256k1_musig_aggnonce *in_stack_fffffffffffffdb8;
  secp256k1_musig_pubnonce *in_stack_fffffffffffffdc0;
  secp256k1_context *in_stack_fffffffffffffdc8;
  undefined1 local_208 [208];
  long local_138;
  size_t in_stack_fffffffffffffed0;
  secp256k1_musig_pubnonce **in_stack_fffffffffffffed8;
  secp256k1_musig_aggnonce *in_stack_fffffffffffffee0;
  secp256k1_context *in_stack_fffffffffffffee8;
  int local_c;
  ulong local_8;
  
  local_8 = 0;
  while( true ) {
    if (1 < local_8) {
      local_8 = 0;
      do {
        if (2 < local_8) {
          return;
        }
        for (local_c = 0; local_c < 2; local_c = local_c + 1) {
          iVar1 = musig_nonce_agg_vector.error_case[local_8].invalid_nonce_idx;
          uVar2 = secp256k1_musig_pubnonce_parse
                            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                             in_stack_fffffffffffffdb8->data);
          if ((iVar1 != local_c) != uVar2) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
                    ,0x351,
                    "test condition failed: expected == secp256k1_musig_pubnonce_parse(CTX, &pubnonce[j], vector->pnonces[c->pnonce_indices[j]])"
                   );
            abort();
          }
        }
        local_8 = local_8 + 1;
      } while( true );
    }
    for (local_c = 0; local_c < 2; local_c = local_c + 1) {
      iVar1 = secp256k1_musig_pubnonce_parse
                        (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                         in_stack_fffffffffffffdb8->data);
      if (iVar1 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
                ,0x345,
                "test condition failed: secp256k1_musig_pubnonce_parse(CTX, &pubnonce[j], vector->pnonces[c->pnonce_indices[j]]) == 1"
               );
        abort();
      }
      (&local_138)[local_c] = (long)(&stack0xfffffffffffffed8 + (long)local_c * 0x84);
    }
    iVar1 = secp256k1_musig_nonce_agg
                      (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8
                       ,in_stack_fffffffffffffed0);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x348,
              "test condition failed: secp256k1_musig_nonce_agg(CTX, &aggnonce, pubnonce_ptr, 2)");
      abort();
    }
    iVar1 = secp256k1_musig_aggnonce_serialize
                      (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0->data,
                       in_stack_fffffffffffffdb8);
    if (iVar1 == 0) break;
    iVar1 = secp256k1_memcmp_var(local_208,musig_nonce_agg_vector.valid_case[local_8].expected,0x21)
    ;
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x34a,"test condition failed: secp256k1_memcmp_var(aggnonce66, c->expected, 33) == 0"
             );
      abort();
    }
    local_8 = local_8 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
          ,0x349,
          "test condition failed: secp256k1_musig_aggnonce_serialize(CTX, aggnonce66, &aggnonce)");
  abort();
}

Assistant:

static void musig_test_vectors_nonceagg(void) {
    size_t i;
    int j;
    const struct musig_nonce_agg_vector *vector = &musig_nonce_agg_vector;

    for (i = 0; i < sizeof(vector->valid_case)/sizeof(vector->valid_case[0]); i++) {
        const struct musig_nonce_agg_test_case *c = &vector->valid_case[i];
        secp256k1_musig_pubnonce pubnonce[2];
        const secp256k1_musig_pubnonce *pubnonce_ptr[2];
        secp256k1_musig_aggnonce aggnonce;
        unsigned char aggnonce66[66];

        for (j = 0; j < 2; j++) {
            CHECK(secp256k1_musig_pubnonce_parse(CTX, &pubnonce[j], vector->pnonces[c->pnonce_indices[j]]) == 1);
            pubnonce_ptr[j] = &pubnonce[j];
        }
        CHECK(secp256k1_musig_nonce_agg(CTX, &aggnonce, pubnonce_ptr, 2));
        CHECK(secp256k1_musig_aggnonce_serialize(CTX, aggnonce66, &aggnonce));
        CHECK(secp256k1_memcmp_var(aggnonce66, c->expected, 33) == 0);
    }
    for (i = 0; i < sizeof(vector->error_case)/sizeof(vector->error_case[0]); i++) {
        const struct musig_nonce_agg_test_case *c = &vector->error_case[i];
        secp256k1_musig_pubnonce pubnonce[2];
        for (j = 0; j < 2; j++) {
            int expected = c->invalid_nonce_idx != j;
            CHECK(expected == secp256k1_musig_pubnonce_parse(CTX, &pubnonce[j], vector->pnonces[c->pnonce_indices[j]]));
        }
    }
}